

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O3

function<bool_(unsigned_int)> *
spvOperandCanBeForwardDeclaredFunction
          (function<bool_(unsigned_int)> *__return_storage_ptr__,Op opcode)

{
  int32_t iVar1;
  code *pcVar2;
  uint uVar3;
  ulong uVar4;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  iVar1 = spvOpcodeGeneratesType(opcode);
  if (iVar1 != 0) {
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
    local_38._8_8_ =
         *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
    (__return_storage_ptr__->super__Function_base)._M_manager =
         std::
         _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:553:11)>
         ::_M_manager;
    local_20 = __return_storage_ptr__->_M_invoker;
    pcVar2 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:553:11)>
             ::_M_invoke;
    goto LAB_001ba0b6;
  }
  if ((int)opcode < 0xf9) {
    if ((int)opcode < 0x47) {
      if ((int)opcode < 0x1c) {
        if (1 < opcode - OpName) {
          uVar3 = opcode - OpEntryPoint;
          goto joined_r0x001b9ea0;
        }
        goto LAB_001ba085;
      }
      if (opcode == OpTypeArray) {
        local_38._M_unused._0_8_ =
             (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
        local_38._8_8_ =
             *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
        *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
        local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
        (__return_storage_ptr__->super__Function_base)._M_manager =
             std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:608:13)>
             ::_M_manager;
        local_20 = __return_storage_ptr__->_M_invoker;
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:608:13)>
                 ::_M_invoke;
        goto LAB_001ba0b6;
      }
      if (opcode == OpTypeForwardPointer) {
        local_38._M_unused._0_8_ =
             (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
        local_38._8_8_ =
             *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
        *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
        local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
        (__return_storage_ptr__->super__Function_base)._M_manager =
             std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:605:13)>
             ::_M_manager;
        local_20 = __return_storage_ptr__->_M_invoker;
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:605:13)>
                 ::_M_invoke;
        goto LAB_001ba0b6;
      }
      if (opcode == OpFunctionCall) {
        local_38._M_unused._0_8_ =
             (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
        local_38._8_8_ =
             *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
        *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
        local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
        (__return_storage_ptr__->super__Function_base)._M_manager =
             std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:581:13)>
             ::_M_manager;
        local_20 = __return_storage_ptr__->_M_invoker;
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:581:13)>
                 ::_M_invoke;
        goto LAB_001ba0b6;
      }
    }
    else if ((int)opcode < 0xf5) {
      if (opcode - OpDecorate < 2) {
LAB_001ba085:
        local_38._M_unused._0_8_ =
             (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
        local_38._8_8_ =
             *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
        *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
        local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
        (__return_storage_ptr__->super__Function_base)._M_manager =
             std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:570:13)>
             ::_M_manager;
        local_20 = __return_storage_ptr__->_M_invoker;
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:570:13)>
                 ::_M_invoke;
        goto LAB_001ba0b6;
      }
      if (opcode - OpGroupDecorate < 2) goto LAB_001b9f9e;
    }
    else {
      if (opcode - OpLoopMerge < 2) goto LAB_001ba085;
      if (opcode == OpPhi) {
        local_38._M_unused._0_8_ =
             (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
        local_38._8_8_ =
             *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
        *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
        local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
        (__return_storage_ptr__->super__Function_base)._M_manager =
             std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:585:13)>
             ::_M_manager;
        local_20 = __return_storage_ptr__->_M_invoker;
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:585:13)>
                 ::_M_invoke;
        goto LAB_001ba0b6;
      }
    }
  }
  else if ((int)opcode < 0x14f6) {
    if ((int)opcode < 0x125) {
      if (opcode - OpBranchConditional < 2) {
LAB_001b9f9e:
        local_38._M_unused._0_8_ =
             (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
        local_38._8_8_ =
             *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
        *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
        local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
        (__return_storage_ptr__->super__Function_base)._M_manager =
             std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:576:13)>
             ::_M_manager;
        local_20 = __return_storage_ptr__->_M_invoker;
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:576:13)>
                 ::_M_invoke;
        goto LAB_001ba0b6;
      }
      if (opcode == OpBranch) goto LAB_001ba085;
      if (opcode == OpEnqueueKernel) {
        local_38._M_unused._0_8_ =
             (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
        local_38._8_8_ =
             *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
        *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
        local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
        (__return_storage_ptr__->super__Function_base)._M_manager =
             std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:590:13)>
             ::_M_manager;
        local_20 = __return_storage_ptr__->_M_invoker;
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:590:13)>
                 ::_M_invoke;
        goto LAB_001ba0b6;
      }
    }
    else {
      uVar4 = (ulong)(opcode - OpGetKernelNDrangeSubGroupCount);
      if (opcode - OpGetKernelNDrangeSubGroupCount < 0x28) {
        if ((3UL >> (uVar4 & 0x3f) & 1) != 0) {
          local_38._M_unused._0_8_ =
               (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor
          ;
          local_38._8_8_ =
               *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8)
          ;
          *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
          local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
          (__return_storage_ptr__->super__Function_base)._M_manager =
               std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:596:13)>
               ::_M_manager;
          local_20 = __return_storage_ptr__->_M_invoker;
          pcVar2 = std::
                   _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:596:13)>
                   ::_M_invoke;
          goto LAB_001ba0b6;
        }
        if ((0xcUL >> (uVar4 & 0x3f) & 1) != 0) {
          local_38._M_unused._0_8_ =
               (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor
          ;
          local_38._8_8_ =
               *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8)
          ;
          *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
          local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
          (__return_storage_ptr__->super__Function_base)._M_manager =
               std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:602:13)>
               ::_M_manager;
          local_20 = __return_storage_ptr__->_M_invoker;
          pcVar2 = std::
                   _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:602:13)>
                   ::_M_invoke;
          goto LAB_001ba0b6;
        }
        if ((0xc000000000U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_001ba085;
      }
    }
  }
  else if ((int)opcode < 0x1600) {
    if (opcode == OpCooperativeMatrixReduceNV) {
      local_38._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
      local_38._8_8_ =
           *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
      (__return_storage_ptr__->super__Function_base)._M_manager =
           std::
           _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:614:13)>
           ::_M_manager;
      local_20 = __return_storage_ptr__->_M_invoker;
      pcVar2 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:614:13)>
               ::_M_invoke;
      goto LAB_001ba0b6;
    }
    if (opcode == OpCooperativeMatrixLoadTensorNV) {
      local_38._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
      local_38._8_8_ =
           *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
      (__return_storage_ptr__->super__Function_base)._M_manager =
           std::
           _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:618:13)>
           ::_M_manager;
      local_20 = __return_storage_ptr__->_M_invoker;
      pcVar2 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:618:13)>
               ::_M_invoke;
      goto LAB_001ba0b6;
    }
    if (opcode == OpCooperativeMatrixPerElementOpNV) {
      local_38._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
      local_38._8_8_ =
           *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
      (__return_storage_ptr__->super__Function_base)._M_manager =
           std::
           _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:611:13)>
           ::_M_manager;
      local_20 = __return_storage_ptr__->_M_invoker;
      pcVar2 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:611:13)>
               ::_M_invoke;
      goto LAB_001ba0b6;
    }
  }
  else {
    uVar3 = opcode - OpDecorateString;
joined_r0x001b9ea0:
    if (uVar3 < 2) goto LAB_001ba085;
  }
  local_38._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
  local_38._8_8_ =
       *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:621:13)>
       ::_M_manager;
  local_20 = __return_storage_ptr__->_M_invoker;
  pcVar2 = std::
           _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:621:13)>
           ::_M_invoke;
LAB_001ba0b6:
  __return_storage_ptr__->_M_invoker = pcVar2;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<bool(unsigned)> spvOperandCanBeForwardDeclaredFunction(
    spv::Op opcode) {
  std::function<bool(unsigned index)> out;
  if (spvOpcodeGeneratesType(opcode)) {
    // All types can use forward pointers.
    out = [](unsigned) { return true; };
    return out;
  }
  switch (opcode) {
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
    case spv::Op::OpEntryPoint:
    case spv::Op::OpName:
    case spv::Op::OpMemberName:
    case spv::Op::OpSelectionMerge:
    case spv::Op::OpDecorate:
    case spv::Op::OpMemberDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
    case spv::Op::OpMemberDecorateStringGOOGLE:
    case spv::Op::OpBranch:
    case spv::Op::OpLoopMerge:
      out = [](unsigned) { return true; };
      break;
    case spv::Op::OpGroupDecorate:
    case spv::Op::OpGroupMemberDecorate:
    case spv::Op::OpBranchConditional:
    case spv::Op::OpSwitch:
      out = [](unsigned index) { return index != 0; };
      break;

    case spv::Op::OpFunctionCall:
      // The Function parameter.
      out = [](unsigned index) { return index == 2; };
      break;

    case spv::Op::OpPhi:
      out = [](unsigned index) { return index > 1; };
      break;

    case spv::Op::OpEnqueueKernel:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 8; };
      break;

    case spv::Op::OpGetKernelNDrangeSubGroupCount:
    case spv::Op::OpGetKernelNDrangeMaxSubGroupSize:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 3; };
      break;

    case spv::Op::OpGetKernelWorkGroupSize:
    case spv::Op::OpGetKernelPreferredWorkGroupSizeMultiple:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 2; };
      break;
    case spv::Op::OpTypeForwardPointer:
      out = [](unsigned index) { return index == 0; };
      break;
    case spv::Op::OpTypeArray:
      out = [](unsigned index) { return index == 1; };
      break;
    case spv::Op::OpCooperativeMatrixPerElementOpNV:
      out = [](unsigned index) { return index == 3; };
      break;
    case spv::Op::OpCooperativeMatrixReduceNV:
      out = [](unsigned index) { return index == 4; };
      break;
    case spv::Op::OpCooperativeMatrixLoadTensorNV:
      // approximate, due to variable operands
      out = [](unsigned index) { return index > 6; };
      break;
    default:
      out = [](unsigned) { return false; };
      break;
  }
  return out;
}